

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiHelper.hpp
# Opt level: O0

void myvk::ImGuiInit<Application::Application()::__1>
               (GLFWwindow *window,Ptr<CommandPool> *command_pool,
               anon_class_1_0_00000001 *font_loader_func)

{
  ImFontAtlas *this;
  initializer_list<VkBufferImageCopy> __l;
  initializer_list<VkBufferImageCopy> __l_00;
  initializer_list<VkBufferImageCopy> __l_01;
  element_type *peVar1;
  ImGuiIO *pIVar2;
  element_type *peVar3;
  VkImage id;
  element_type *peVar4;
  element_type *this_00;
  element_type *regions;
  VkBufferImageCopy region;
  Ptr<CommandBuffer> command_buffer;
  Ptr<Buffer> staging_buffer;
  Ptr<Fence> fence;
  uint32_t data_size;
  int height;
  int width;
  uchar *data;
  undefined1 install_callbacks;
  undefined4 uVar6;
  shared_ptr<myvk::Buffer> *__r;
  shared_ptr<myvk::Image> *psVar5;
  shared_ptr<myvk::ImageView> *__r_00;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffba4;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffbac;
  Fence *in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb8;
  VkCommandBufferUsageFlags in_stack_fffffffffffffbbc;
  CommandBuffer *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  ImFontAtlas *in_stack_fffffffffffffbd0;
  Ptr<BufferBase> *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 uVar9;
  VkImageLayout in_stack_fffffffffffffbe4;
  VkImageLayout VVar10;
  VkAccessFlags in_stack_fffffffffffffbe8;
  VkAccessFlags in_stack_fffffffffffffbec;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *in_stack_fffffffffffffbf0;
  ImageBase *in_stack_fffffffffffffbf8;
  ImageBase *this_01;
  CommandBuffer *in_stack_fffffffffffffc00;
  Ptr<Device> *device;
  VkImageLayout new_layout;
  undefined8 in_stack_fffffffffffffc10;
  VkFenceCreateFlags usage;
  uint32_t uVar11;
  Ptr<Device> *in_stack_fffffffffffffc18;
  undefined8 uVar12;
  uint32_t dst_queue_family;
  VkExtent2D *in_stack_fffffffffffffc20;
  VkCommandBufferLevel level;
  undefined8 uVar13;
  Ptr<CommandPool> *in_stack_fffffffffffffc28;
  uint32_t layer_count;
  CommandBuffer *this_02;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_fffffffffffffc40;
  ImageBase local_329;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  Ptr<Device> local_269 [2];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_1d9 [49];
  undefined8 local_1a8;
  undefined1 *local_198;
  undefined8 local_190;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  int local_120;
  int iStack_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 uStack_110;
  undefined4 local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined4 uStack_e0;
  int iStack_dc;
  int iStack_d8;
  undefined4 uStack_d4;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  shared_ptr<myvk::Image> local_68;
  undefined8 local_58;
  int local_48;
  int local_44;
  int local_2c;
  int local_28;
  int local_24;
  VkComponentMapping *local_20;
  
  usage = (VkFenceCreateFlags)((ulong)in_stack_fffffffffffffc10 >> 0x20);
  install_callbacks = 0;
  ImGui::DebugCheckVersionAndDataLayout
            ((char *)in_stack_fffffffffffffbc0,
             CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
             (size_t)in_stack_fffffffffffffbb0,
             CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),2,
             (size_t)in_stack_fffffffffffffbd0);
  ImGui::CreateContext(in_stack_fffffffffffffbd0);
  ImGui_ImplGlfw_InitForVulkan
            ((GLFWwindow *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (bool)install_callbacks);
  Application::Application::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)0x11d4a7)
  ;
  ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            ((ImFontAtlas *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (uchar **)in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0,
             (int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (int *)in_stack_fffffffffffffbc0);
  local_2c = local_24 * local_28 * 4;
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d500);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_48 = local_24;
  local_44 = local_28;
  local_68.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 0;
  psVar5 = &local_68;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x11d55c);
  Image::CreateTexture2D
            ((Ptr<Device> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
             (uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20),
             (VkFormat)in_stack_fffffffffffffc18,usage,in_stack_fffffffffffffc40);
  level = (VkCommandBufferLevel)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  std::shared_ptr<myvk::Image>::operator=
            ((shared_ptr<myvk::Image> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),psVar5);
  uVar6 = (undefined4)((ulong)psVar5 >> 0x20);
  std::shared_ptr<myvk::Image>::~shared_ptr((shared_ptr<myvk::Image> *)0x11d5cd);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffbb0);
  pIVar2 = ImGui::GetIO();
  this = pIVar2->Fonts;
  peVar3 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11d5fb);
  id = ImageBase::GetHandle(&peVar3->super_ImageBase);
  ImFontAtlas::SetTexID(this,id);
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d620);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  Fence::Create(in_stack_fffffffffffffc18,usage);
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d64b);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )0x11d6af);
  Buffer::CreateStaging<unsigned_char*>
            ((Ptr<Device> *)in_stack_fffffffffffffbd8,&in_stack_fffffffffffffbd0->Locked,
             (uchar *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffbc0);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )in_stack_fffffffffffffbb0);
  CommandBuffer::Create(in_stack_fffffffffffffc28,level);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11d711);
  CommandBuffer::Begin(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbbc);
  VVar10 = (VkImageLayout)((ulong)in_stack_fffffffffffffbc0 >> 0x20);
  uVar12 = 0;
  uVar13 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 1;
  uStack_f0 = 0x100000000;
  local_114 = 0;
  uStack_110 = 0;
  local_10c = 0;
  uStack_e0 = 0;
  local_e8 = 0;
  local_120 = local_24;
  iStack_11c = local_28;
  local_118 = 1;
  uStack_d4 = 1;
  iStack_dc = local_24;
  iStack_d8 = local_28;
  peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d82e);
  new_layout = (VkImageLayout)peVar4;
  local_128 = 0;
  local_138 = uVar12;
  uStack_130 = uVar13;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x11d85c);
  local_148 = 0;
  local_158 = uVar12;
  uStack_150 = uVar13;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x11d885);
  dst_queue_family = (uint32_t)uVar13;
  uVar11 = (uint32_t)uVar12;
  peVar3 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11d891);
  local_1a8 = CONCAT44(uStack_d4,iStack_d8);
  local_1d9._41_8_ = CONCAT44(iStack_dc,uStack_e0);
  local_1d9._33_8_ = local_e8;
  local_1d9._17_8_ = local_f8;
  local_1d9._25_8_ = uStack_f0;
  local_1d9._1_8_ = local_108;
  local_1d9._9_8_ = uStack_100;
  local_198 = local_1d9 + 1;
  local_190 = 1;
  this_02 = (CommandBuffer *)local_1d9;
  std::allocator<VkBufferImageCopy>::allocator((allocator<VkBufferImageCopy> *)0x11d90a);
  __l._M_len._0_4_ = in_stack_fffffffffffffbe0;
  __l._M_array = (iterator)in_stack_fffffffffffffbd8;
  __l._M_len._4_4_ = in_stack_fffffffffffffbe4;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffbd0,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  uVar7 = 0xffffffff;
  __r = (shared_ptr<myvk::Buffer> *)CONCAT44(uVar6,7);
  ImageBase::GetDstMemoryBarriers
            (in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,new_layout,uVar11,dst_queue_family)
  ;
  CommandBuffer::CmdPipelineBarrier
            (in_stack_fffffffffffffc00,
             (VkPipelineStageFlags)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
             (VkPipelineStageFlags)in_stack_fffffffffffffbf8,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffbf0,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffbb0);
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffbb0);
  std::allocator<VkBufferImageCopy>::~allocator((allocator<VkBufferImageCopy> *)local_1d9);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffffbb0);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffbb0)
  ;
  peVar4 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11d9ef);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            ((shared_ptr<myvk::BufferBase> *)CONCAT44(in_stack_fffffffffffffba4,uVar7),__r);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffba4,uVar7),
             (shared_ptr<myvk::Image> *)__r);
  uVar6 = (undefined4)((ulong)__r >> 0x20);
  local_238 = CONCAT44(uStack_d4,iStack_d8);
  uStack_240 = CONCAT44(iStack_dc,uStack_e0);
  local_248 = local_e8;
  local_269[1].super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._1_8_ = local_f8;
  stack0xfffffffffffffdb0 = uStack_f0;
  local_269[0].super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._1_8_ = local_108;
  local_269._9_8_ = uStack_100;
  local_228 = (undefined1 *)
              ((long)&local_269[0].super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1);
  local_220 = 1;
  device = local_269;
  std::allocator<VkBufferImageCopy>::allocator((allocator<VkBufferImageCopy> *)0x11da8b);
  __l_00._M_len._0_4_ = in_stack_fffffffffffffbe0;
  __l_00._M_array = (iterator)in_stack_fffffffffffffbd8;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffbe4;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffbd0,__l_00,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  CommandBuffer::CmdCopy
            ((CommandBuffer *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbd8,(Ptr<ImageBase> *)in_stack_fffffffffffffbd0,
             (vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),VVar10);
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffbb0);
  std::allocator<VkBufferImageCopy>::~allocator((allocator<VkBufferImageCopy> *)local_269);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x11db00);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x11db0d);
  this_00 = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x11db1a);
  uVar12 = 0;
  uVar9 = 0;
  VVar10 = VK_IMAGE_LAYOUT_UNDEFINED;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 0;
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)0x11db48);
  uStack_2a0 = CONCAT44(VVar10,uVar9);
  local_298 = 0;
  local_2a8 = uVar12;
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)0x11db6e);
  regions = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )0x11db7a);
  local_329._53_4_ = uStack_d4;
  local_329._49_4_ = iStack_d8;
  local_329._45_4_ = iStack_dc;
  local_329.m_extent._5_4_ = uStack_e0;
  local_329._33_8_ = local_e8;
  local_329._17_8_ = local_f8;
  local_329._25_8_ = uStack_f0;
  local_329.super_DeviceObjectBase.super_Base._1_8_ = local_108;
  local_329.super_DeviceObjectBase.super_Base.super_enable_shared_from_this<myvk::Base>._M_weak_this
  .super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._1_8_ = uStack_100;
  local_2e8 = (undefined1 *)((long)&local_329.super_DeviceObjectBase.super_Base._vptr_Base + 1);
  local_2e0 = 1;
  this_01 = &local_329;
  std::allocator<VkBufferImageCopy>::allocator((allocator<VkBufferImageCopy> *)0x11dbed);
  __l_01._M_len._0_4_ = uVar9;
  __l_01._M_array = (iterator)uVar12;
  __l_01._M_len._4_4_ = VVar10;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)this_00,__l_01,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
  uVar8 = 0xffffffff;
  uVar7 = 0xffffffff;
  psVar5 = (shared_ptr<myvk::Image> *)CONCAT44(uVar6,5);
  ImageBase::GetDstMemoryBarriers
            (this_01,(vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)regions,
             in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8,VVar10,new_layout,uVar11,
             dst_queue_family);
  CommandBuffer::CmdPipelineBarrier
            (peVar4,(VkPipelineStageFlags)((ulong)this_01 >> 0x20),(VkPipelineStageFlags)this_01,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)regions,
             (vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
             (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             CONCAT44(VVar10,uVar9));
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::~vector
            ((vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> *)
             in_stack_fffffffffffffbb0);
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::~vector
            ((vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *)
             in_stack_fffffffffffffbb0);
  std::allocator<VkBufferImageCopy>::~allocator((allocator<VkBufferImageCopy> *)&local_329);
  std::vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>::~vector
            ((vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> *)
             in_stack_fffffffffffffbb0);
  std::vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_>::~vector
            ((vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)in_stack_fffffffffffffbb0)
  ;
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11dcd1);
  CommandBuffer::End((CommandBuffer *)0x11dcd9);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x11dce8);
  CommandBuffer::Submit(this_02,(Ptr<Fence> *)peVar3);
  layer_count = (uint32_t)this_02;
  uVar11 = (uint32_t)peVar3;
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11dd07)
  ;
  Fence::Wait(in_stack_fffffffffffffbb0,CONCAT44(in_stack_fffffffffffffbac,uVar8));
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x11dd25);
  std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x11dd32);
  std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x11dd3f);
  std::shared_ptr<myvk::ImageBase>::shared_ptr<myvk::Image,void>
            ((shared_ptr<myvk::ImageBase> *)CONCAT44(in_stack_fffffffffffffba4,uVar7),psVar5);
  uVar6 = (undefined4)((ulong)psVar5 >> 0x20);
  peVar3 = std::__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11dd62);
  ImageBase::GetFormat(&peVar3->super_ImageBase);
  uVar7 = 0;
  __r_00 = (shared_ptr<myvk::ImageView> *)CONCAT44(uVar6,1);
  ImageView::Create((Ptr<ImageBase> *)device,(VkImageViewType)((ulong)peVar4 >> 0x20),
                    (VkFormat)peVar4,(VkImageAspectFlags)((ulong)this_01 >> 0x20),(uint32_t)this_01,
                    dst_queue_family,uVar11,layer_count,local_20);
  std::shared_ptr<myvk::ImageView>::operator=
            ((shared_ptr<myvk::ImageView> *)CONCAT44(in_stack_fffffffffffffba4,uVar7),__r_00);
  std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x11de0b);
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x11de18);
  peVar1 = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11de25);
  (*(peVar1->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  Sampler::Create(device,(VkFilter)((ulong)peVar4 >> 0x20),(VkSamplerAddressMode)peVar4,
                  (VkSamplerMipmapMode)((ulong)this_01 >> 0x20),SUB84(this_01,0),
                  SUB81((ulong)regions >> 0x38,0),SUB84(regions,0));
  std::shared_ptr<myvk::Sampler>::operator=
            ((shared_ptr<myvk::Sampler> *)CONCAT44(in_stack_fffffffffffffba4,uVar7),
             (shared_ptr<myvk::Sampler> *)__r_00);
  std::shared_ptr<myvk::Sampler>::~shared_ptr((shared_ptr<myvk::Sampler> *)0x11de82);
  return;
}

Assistant:

inline void ImGuiInit(GLFWwindow *window, const Ptr<CommandPool> &command_pool, FontLoaderFunc &&font_loader_func) {
	IMGUI_CHECKVERSION();
	ImGui::CreateContext();
	ImGui_ImplGlfw_InitForVulkan(window, true);

	font_loader_func();

	unsigned char *data;
	int width, height;
	ImGui::GetIO().Fonts->GetTexDataAsRGBA32(&data, &width, &height);
	uint32_t data_size = width * height * 4;

	kImGuiInfo.font_texture =
	    Image::CreateTexture2D(command_pool->GetDevicePtr(), {(uint32_t)width, (uint32_t)height}, 1,
	                           VK_FORMAT_R8G8B8A8_UNORM, VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	ImGui::GetIO().Fonts->SetTexID((ImTextureID)(intptr_t)kImGuiInfo.font_texture->GetHandle());

	{
		Ptr<Fence> fence = Fence::Create(command_pool->GetDevicePtr());
		Ptr<Buffer> staging_buffer = Buffer::CreateStaging(command_pool->GetDevicePtr(), data, data + data_size);

		Ptr<CommandBuffer> command_buffer = CommandBuffer::Create(command_pool);
		command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);

		VkBufferImageCopy region = {};
		region.bufferOffset = 0;
		region.bufferRowLength = 0;
		region.bufferImageHeight = 0;
		region.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
		region.imageSubresource.mipLevel = 0;
		region.imageSubresource.baseArrayLayer = 0;
		region.imageSubresource.layerCount = 1;
		region.imageOffset = {0, 0, 0};
		region.imageExtent = {(uint32_t)width, (uint32_t)height, 1};

		command_buffer->CmdPipelineBarrier(VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
		                                   kImGuiInfo.font_texture->GetDstMemoryBarriers(
		                                       {region}, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
		                                       VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL));
		command_buffer->CmdCopy(staging_buffer, kImGuiInfo.font_texture, {region});
		command_buffer->CmdPipelineBarrier(
		    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, {}, {},
		    kImGuiInfo.font_texture->GetDstMemoryBarriers(
		        {region}, VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
		        VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL));

		command_buffer->End();

		command_buffer->Submit(fence);
		fence->Wait();
	}

	kImGuiInfo.font_texture_view = ImageView::Create(kImGuiInfo.font_texture, VK_IMAGE_VIEW_TYPE_2D,
	                                                 kImGuiInfo.font_texture->GetFormat(), VK_IMAGE_ASPECT_COLOR_BIT);
	kImGuiInfo.font_texture_sampler =
	    Sampler::Create(command_pool->GetDevicePtr(), VK_FILTER_LINEAR, VK_SAMPLER_ADDRESS_MODE_REPEAT);
}